

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  ~IfcObjectDefinition(this);
  operator_delete(this);
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}